

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void __thiscall Rml::DataParser::VariableGetSet(DataParser *this,String *name,bool is_assignment)

{
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  int local_a4;
  value_type local_a0;
  int local_6c;
  undefined4 local_68;
  int index;
  String local_58;
  undefined1 local_38 [8];
  DataAddress address;
  bool is_assignment_local;
  String *name_local;
  DataParser *this_local;
  
  address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = is_assignment;
  DataExpressionInterface::ParseAddress((DataAddress *)local_38,&this->expression_interface,name);
  bVar1 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                    ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                     local_38);
  if (bVar1) {
    uVar2 = ::std::__cxx11::string::c_str();
    CreateString_abi_cxx11_(&local_58,"Could not find data variable with name \'%s\'.",uVar2);
    Error(this,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    local_68 = 1;
  }
  else {
    sVar3 = ::std::
            vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
            ::size(&this->variable_addresses);
    local_6c = (int)sVar3;
    ::std::
    vector<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
    ::push_back(&this->variable_addresses,(value_type *)local_38);
    local_a0.instruction = Variable;
    if ((address.super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      local_a0.instruction = Assign;
    }
    local_a4 = local_6c;
    Variant::Variant<int,void>(&local_a0.data,&local_a4);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::push_back
              (&this->program,&local_a0);
    InstructionData::~InstructionData(&local_a0);
    local_68 = 0;
  }
  ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
            ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_38);
  return;
}

Assistant:

void VariableGetSet(const String& name, bool is_assignment)
	{
		DataAddress address = expression_interface.ParseAddress(name);
		if (address.empty())
		{
			Error(CreateString("Could not find data variable with name '%s'.", name.c_str()));
			return;
		}
		int index = int(variable_addresses.size());
		variable_addresses.push_back(std::move(address));
		program.push_back(InstructionData{is_assignment ? Instruction::Assign : Instruction::Variable, Variant(int(index))});
	}